

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrBodyJointLocationBD *value)

{
  XrResult XVar1;
  undefined7 in_register_00000009;
  uint32_t in_stack_fffffffffffffdfc;
  allocator local_1f9;
  string local_1f8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1d8;
  string local_1c0;
  ostringstream oss_enum;
  
  XVar1 = XR_SUCCESS;
  if (((int)CONCAT71(in_register_00000009,check_members) != 0) && (0xf < value->locationFlags)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_enum);
    std::operator<<((ostream *)&oss_enum,
                    "XrBodyJointLocationBD invalid member XrSpaceLocationFlags \"locationFlags\" flag value "
                   );
    Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffdfc);
    std::operator<<((ostream *)&oss_enum,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::operator<<((ostream *)&oss_enum," contains illegal bit");
    std::__cxx11::string::string
              ((string *)&local_1f8,"VUID-XrBodyJointLocationBD-locationFlags-parameter",&local_1f9)
    ;
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1d8,objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage(instance_info,&local_1f8,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1d8,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_enum);
    XVar1 = XR_ERROR_VALIDATION_FAILURE;
  }
  return XVar1;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrBodyJointLocationBD* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    ValidateXrFlagsResult space_location_flags_result = ValidateXrSpaceLocationFlags(value->locationFlags);
    // Valid flags available, so it must be invalid to fail.
    if (VALIDATE_XR_FLAGS_INVALID == space_location_flags_result) {
        // Otherwise, flags must be valid.
        std::ostringstream oss_enum;
        oss_enum << "XrBodyJointLocationBD invalid member XrSpaceLocationFlags \"locationFlags\" flag value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->locationFlags));
        oss_enum <<" contains illegal bit";
        CoreValidLogMessage(instance_info, "VUID-XrBodyJointLocationBD-locationFlags-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Everything checked out properly
    return xr_result;
}